

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcSimpleProperty::IfcSimpleProperty(IfcSimpleProperty *this,void **vtt)

{
  _func_int **pp_Var1;
  void *pvVar2;
  
  pp_Var1 = (_func_int **)vtt[2];
  (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  _vptr_ObjectHelper = pp_Var1;
  *(void **)((long)&(this->super_IfcProperty).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>._vptr_ObjectHelper
            + (long)pp_Var1[-3]) = vtt[3];
  (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  aux_is_derived.super__Base_bitset<1UL>._M_w = 0;
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  _vptr_ObjectHelper = pp_Var1;
  *(void **)((long)&(this->super_IfcProperty).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>._vptr_ObjectHelper
            + (long)pp_Var1[-3]) = vtt[4];
  *(undefined1 **)
   &(this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
    field_0x10 = &(this->super_IfcProperty).
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.field_0x20;
  *(undefined8 *)
   &(this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
    field_0x18 = 0;
  (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.field_0x20
       = 0;
  (this->super_IfcProperty).Description.ptr._M_dataplus._M_p =
       (pointer)&(this->super_IfcProperty).Description.ptr.field_2;
  (this->super_IfcProperty).Description.ptr._M_string_length = 0;
  (this->super_IfcProperty).Description.ptr.field_2._M_local_buf[0] = '\0';
  (this->super_IfcProperty).Description.have = false;
  pvVar2 = vtt[5];
  *(void **)&(this->super_IfcProperty).field_0x58 = pvVar2;
  *(void **)(&(this->super_IfcProperty).field_0x58 + *(long *)((long)pvVar2 + -0x18)) = vtt[6];
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  _vptr_ObjectHelper = pp_Var1;
  *(void **)((long)&(this->super_IfcProperty).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>._vptr_ObjectHelper
            + (long)pp_Var1[-3]) = vtt[7];
  *(void **)&(this->super_IfcProperty).field_0x58 = vtt[8];
  return;
}

Assistant:

ObjectHelper()
        : aux_is_derived(0) {
            // empty
        }